

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlDocPtr xmlParseCatalogFile(char *filename)

{
  int iVar1;
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputBufferPtr in;
  xmlParserInputPtr input;
  xmlChar *pxVar2;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr inputStream;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr ret;
  char *filename_local;
  
  ctxt_00 = xmlNewParserCtxt();
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    xmlCatalogErrMemory();
    filename_local = (char *)0x0;
  }
  else {
    in = xmlParserInputBufferCreateFilename(filename,XML_CHAR_ENCODING_NONE);
    if (in == (xmlParserInputBufferPtr)0x0) {
      xmlFreeParserCtxt(ctxt_00);
      filename_local = (char *)0x0;
    }
    else {
      input = xmlNewInputStream(ctxt_00);
      if (input == (xmlParserInputPtr)0x0) {
        xmlFreeParserInputBuffer(in);
        xmlFreeParserCtxt(ctxt_00);
        filename_local = (char *)0x0;
      }
      else {
        pxVar2 = xmlCanonicPath((xmlChar *)filename);
        input->filename = (char *)pxVar2;
        input->buf = in;
        xmlBufResetInput(in->buffer,input);
        iVar1 = xmlCtxtPushInput(ctxt_00,input);
        if (iVar1 < 0) {
          xmlFreeInputStream(input);
          xmlFreeParserCtxt(ctxt_00);
          filename_local = (char *)0x0;
        }
        else {
          ctxt_00->valid = 0;
          ctxt_00->validate = 0;
          ctxt_00->loadsubset = 0;
          ctxt_00->pedantic = 0;
          ctxt_00->dictNames = 1;
          xmlParseDocument(ctxt_00);
          if (ctxt_00->wellFormed == 0) {
            ctxt = (xmlParserCtxtPtr)0x0;
            xmlFreeDoc(ctxt_00->myDoc);
            ctxt_00->myDoc = (xmlDocPtr)0x0;
          }
          else {
            ctxt = (xmlParserCtxtPtr)ctxt_00->myDoc;
          }
          xmlFreeParserCtxt(ctxt_00);
          filename_local = (char *)ctxt;
        }
      }
    }
  }
  return (xmlDocPtr)filename_local;
}

Assistant:

xmlDocPtr
xmlParseCatalogFile(const char *filename) {
    xmlDocPtr ret;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr inputStream;
    xmlParserInputBufferPtr buf;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL) {
        xmlCatalogErrMemory();
	return(NULL);
    }

    buf = xmlParserInputBufferCreateFilename(filename, XML_CHAR_ENCODING_NONE);
    if (buf == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    inputStream = xmlNewInputStream(ctxt);
    if (inputStream == NULL) {
	xmlFreeParserInputBuffer(buf);
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    inputStream->filename = (char *) xmlCanonicPath((const xmlChar *)filename);
    inputStream->buf = buf;
    xmlBufResetInput(buf->buffer, inputStream);

    if (xmlCtxtPushInput(ctxt, inputStream) < 0) {
        xmlFreeInputStream(inputStream);
        xmlFreeParserCtxt(ctxt);
        return(NULL);
    }

    ctxt->valid = 0;
    ctxt->validate = 0;
    ctxt->loadsubset = 0;
    ctxt->pedantic = 0;
    ctxt->dictNames = 1;

    xmlParseDocument(ctxt);

    if (ctxt->wellFormed)
	ret = ctxt->myDoc;
    else {
        ret = NULL;
        xmlFreeDoc(ctxt->myDoc);
        ctxt->myDoc = NULL;
    }
    xmlFreeParserCtxt(ctxt);

    return(ret);
}